

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O0

void __thiscall DHUDMessage::Serialize(DHUDMessage *this,FSerializer *arc)

{
  bool bVar1;
  FSerializer *pFVar2;
  FSerializer *arc_local;
  DHUDMessage *this_local;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar2 = FSerializer::operator()(arc,"left",&this->Left);
  pFVar2 = FSerializer::operator()(pFVar2,"top",&this->Top);
  pFVar2 = FSerializer::operator()(pFVar2,"centerx",&this->CenterX);
  pFVar2 = FSerializer::operator()(pFVar2,"holdtics",&this->HoldTics);
  pFVar2 = FSerializer::operator()(pFVar2,"tics",&this->Tics);
  pFVar2 = FSerializer::operator()(pFVar2,"state",&this->State);
  pFVar2 = FSerializer::Enum<EColorRange>(pFVar2,"textcolor",&this->TextColor);
  pFVar2 = FSerializer::operator()(pFVar2,"sbarid",&this->SBarID);
  pFVar2 = FSerializer::operator()(pFVar2,"sourcetext",&this->SourceText);
  pFVar2 = FSerializer::operator()(pFVar2,"font",&this->Font);
  pFVar2 = FSerializer::operator()(pFVar2,"next",&this->Next);
  pFVar2 = FSerializer::operator()(pFVar2,"hudwidth",&this->HUDWidth);
  pFVar2 = FSerializer::operator()(pFVar2,"hudheight",&this->HUDHeight);
  pFVar2 = FSerializer::operator()(pFVar2,"nowrap",&this->NoWrap);
  pFVar2 = FSerializer::operator()(pFVar2,"clipx",&this->ClipX);
  pFVar2 = FSerializer::operator()(pFVar2,"clipy",&this->ClipY);
  pFVar2 = FSerializer::operator()(pFVar2,"clipwidth",&this->ClipWidth);
  pFVar2 = FSerializer::operator()(pFVar2,"clipheight",&this->ClipHeight);
  pFVar2 = FSerializer::operator()(pFVar2,"wrapwidth",&this->WrapWidth);
  pFVar2 = FSerializer::operator()(pFVar2,"handleaspect",&this->HandleAspect);
  pFVar2 = FSerializer::operator()(pFVar2,"visibilityflags",&this->VisibilityFlags);
  pFVar2 = FSerializer::operator()(pFVar2,"style",&this->Style);
  FSerializer::operator()(pFVar2,"alpha",&this->Alpha);
  bVar1 = FSerializer::isReading(arc);
  if (bVar1) {
    this->Lines = (FBrokenLines *)0x0;
    (*(this->super_DObject)._vptr_DObject[7])(this,this->SourceText);
  }
  return;
}

Assistant:

void DHUDMessage::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("left", Left)
		("top", Top)
		("centerx", CenterX)
		("holdtics", HoldTics)
		("tics", Tics)
		("state", State)
		.Enum("textcolor", TextColor)
		("sbarid", SBarID)
		("sourcetext", SourceText)
		("font", Font)
		("next", Next)
		("hudwidth", HUDWidth)
		("hudheight", HUDHeight)
		("nowrap", NoWrap)
		("clipx", ClipX)
		("clipy", ClipY)
		("clipwidth", ClipWidth)
		("clipheight", ClipHeight)
		("wrapwidth", WrapWidth)
		("handleaspect", HandleAspect)
		("visibilityflags", VisibilityFlags)
		("style", Style)
		("alpha", Alpha);

	if (arc.isReading())
	{
		Lines = NULL;
		ResetText(SourceText);
	}
}